

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpSolver.cc
# Opt level: O0

void __thiscall Minisat::SimpSolver::garbageCollect(SimpSolver *this)

{
  uint32_t uVar1;
  long in_RDI;
  ClauseAllocator to;
  ClauseAllocator *in_stack_000000b8;
  Solver *in_stack_000000c0;
  undefined4 in_stack_ffffffffffffff98;
  uint32_t in_stack_ffffffffffffff9c;
  undefined4 in_stack_ffffffffffffffa0;
  uint in_stack_ffffffffffffffa4;
  ClauseAllocator *in_stack_ffffffffffffffd8;
  SimpSolver *in_stack_ffffffffffffffe0;
  
  RegionAllocator<unsigned_int>::size((RegionAllocator<unsigned_int> *)(in_RDI + 0x508));
  RegionAllocator<unsigned_int>::wasted((RegionAllocator<unsigned_int> *)(in_RDI + 0x508));
  ClauseAllocator::ClauseAllocator
            ((ClauseAllocator *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
             in_stack_ffffffffffffff9c);
  relocAll(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  Solver::relocAll(in_stack_000000c0,in_stack_000000b8);
  if (1 < *(int *)(in_RDI + 0x34)) {
    uVar1 = RegionAllocator<unsigned_int>::size((RegionAllocator<unsigned_int> *)(in_RDI + 0x508));
    in_stack_ffffffffffffffa4 = uVar1 << 2;
    uVar1 = RegionAllocator<unsigned_int>::size
                      ((RegionAllocator<unsigned_int> *)&stack0xffffffffffffffe0);
    printf("c |  Garbage collection:   %12d bytes => %12d bytes             |\n",
           (ulong)in_stack_ffffffffffffffa4,(ulong)(uVar1 << 2));
  }
  ClauseAllocator::moveTo
            ((ClauseAllocator *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
             (ClauseAllocator *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  ClauseAllocator::~ClauseAllocator((ClauseAllocator *)0x15ea4b);
  return;
}

Assistant:

void SimpSolver::garbageCollect()
{
    // Initialize the next region to a size corresponding to the estimated utilization degree. This
    // is not precise but should avoid some unnecessary reallocations for the new region:
    ClauseAllocator to(ca.size() - ca.wasted());

    to.extra_clause_field = ca.extra_clause_field; // NOTE: this is important to keep (or lose) the extra fields.
    relocAll(to);
    Solver::relocAll(to);
    if (verbosity >= 2)
        printf("c |  Garbage collection:   %12d bytes => %12d bytes             |\n",
               ca.size() * ClauseAllocator::Unit_Size, to.size() * ClauseAllocator::Unit_Size);
    to.moveTo(ca);
}